

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void lj_debug_addloc(lua_State *L,char *msg,cTValue *frame,cTValue *nextframe)

{
  uint uVar1;
  uint *in_RDX;
  undefined8 in_RSI;
  lua_State *in_RDI;
  char buf [60];
  GCproto *pt;
  BCLine line;
  GCfunc *fn;
  undefined1 auStack_78 [16];
  cTValue *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  BCLine in_stack_ffffffffffffffa4;
  lua_State *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  if (((in_RDX == (uint *)0x0) || (*(char *)((ulong)*in_RDX + 6) != '\0')) ||
     (uVar1 = lj_debug_frameline(in_stack_ffffffffffffffa8,
                                 (GCfunc *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98), (int)uVar1 < 0)) {
    lj_strfmt_pushf(in_RDI,"%s",in_RSI);
  }
  else {
    lj_debug_shortname(in_stack_ffffffffffffffb0,(GCstr *)in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4);
    lj_strfmt_pushf(in_RDI,"%s:%d: %s",auStack_78,(ulong)uVar1,in_RSI);
  }
  return;
}

Assistant:

void lj_debug_addloc(lua_State *L, const char *msg,
		     cTValue *frame, cTValue *nextframe)
{
  if (frame) {
    GCfunc *fn = frame_func(frame);
    if (isluafunc(fn)) {
      BCLine line = lj_debug_frameline(L, fn, nextframe);
      if (line >= 0) {
	GCproto *pt = funcproto(fn);
	char buf[LUA_IDSIZE];
	lj_debug_shortname(buf, proto_chunkname(pt), pt->firstline);
	lj_strfmt_pushf(L, "%s:%d: %s", buf, line, msg);
	return;
      }
    }
  }
  lj_strfmt_pushf(L, "%s", msg);
}